

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree_str_kv_test.cc
# Opt level: O2

void kv_get_nth_splitter_test(void)

{
  void *__ptr;
  int iVar1;
  size_t sVar2;
  bnode *__ptr_00;
  char *pcVar3;
  __suseconds_t *p_Var4;
  long lVar5;
  btree_kv_ops bStack_108;
  undefined8 uStack_90;
  undefined1 local_88 [8];
  timeval __test_begin;
  void *local_40;
  void *key;
  uint8_t v;
  
  uStack_90 = 0x103bea;
  gettimeofday((timeval *)local_88,(__timezone_ptr_t)0x0);
  uStack_90 = 0x103bef;
  memleak_start();
  for (lVar5 = 0; lVar5 != 0x30; lVar5 = lVar5 + 8) {
    pcVar3 = *(char **)((long)&DAT_00108d70 + lVar5);
    uStack_90 = 0x103c08;
    sVar2 = strlen(pcVar3);
    uStack_90 = 0x103c1d;
    construct_key_ptr(pcVar3,(short)sVar2 + 1,(void *)((long)&__test_begin.tv_usec + lVar5));
  }
  uStack_90 = 0x103c30;
  __ptr_00 = dummy_node('\t','\x01',1);
  __ptr_00->nentry = 6;
  key._7_1_ = 'd';
  btree_str_kv_get_kb64_vb64(&bStack_108);
  p_Var4 = &__test_begin.tv_usec;
  for (lVar5 = 0; lVar5 != 6; lVar5 = lVar5 + 1) {
    (*bStack_108.set_kv)(__ptr_00,(idx_t)lVar5,p_Var4,(void *)((long)&key + 7));
    key._7_1_ = key._7_1_ + '\x01';
    p_Var4 = p_Var4 + 1;
  }
  local_40 = (void *)0x0;
  (*bStack_108.get_nth_splitter)((bnode *)0x0,__ptr_00,&local_40);
  __ptr = local_40;
  iVar1 = bcmp(local_40,(void *)__test_begin.tv_usec,9);
  if (iVar1 == 0) {
    free(__ptr_00);
    free(__ptr);
    freevars((void **)&__test_begin.tv_usec,6);
    memleak_end();
    pcVar3 = "%s PASSED\n";
    if (kv_get_nth_splitter_test()::__test_pass != '\0') {
      pcVar3 = "%s FAILED\n";
    }
    fprintf(_stderr,pcVar3,"kv_get_nth_splitter_test");
    return;
  }
  fprintf(_stderr,"Test failed: %s %d\n",
          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_str_kv_test.cc"
          ,0x48f);
  kv_get_nth_splitter_test()::__test_pass = 1;
  __assert_fail("cmp == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_str_kv_test.cc"
                ,0x48f,"void kv_get_nth_splitter_test()");
}

Assistant:

void kv_get_nth_splitter_test()
{
    TEST_INIT();
    memleak_start();

    bnoderef node;
    btree_kv_ops *kv_ops;
    uint8_t ksize, vsize;
    uint8_t v;
    idx_t idx;
    int cmp;
    void *key;

    const char *keys[] = {"string",
                          "longstring",
                          "longerstring",
                          "",
                          "123231234242423428492342",
                          "string with space"};

    int n =  sizeof(keys)/sizeof(void *);
    void **key_ptrs = alca(void *, n);

    for (int i = 0; i < n; i++) {
        construct_key_ptr(keys[i], strlen(keys[i]) + 1, &key_ptrs[i]);
    }

    ksize = strlen(keys[0]) + 1 + sizeof(key_len_t);
    vsize = sizeof(v);
    node = dummy_node(ksize, vsize, 1);
    node->nentry = n;

    v = 100;
    kv_ops = alca(btree_kv_ops, 1);
    btree_str_kv_get_kb64_vb64(kv_ops);

    // set n keys
    for (idx = 0; idx < n; idx ++){
        kv_ops->set_kv(node, idx, &key_ptrs[idx], (void *)&v);
        v++;
    }

    // set *key to nth_splitter
    key = NULL;
    kv_ops->get_nth_splitter(NULL, node, &key);

    // verify key[0] is set as splitter
    cmp = memcmp(key, key_ptrs[0], ksize);
    TEST_CHK(cmp == 0);

    free(node);
    free(key);
    freevars(key_ptrs, n);
    memleak_end();
    TEST_RESULT("kv_get_nth_splitter_test");
}